

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O3

void TestEq<int,int>(int expval,int val,char *file,int line,char *func)

{
  long *expval_00;
  stringstream ss2;
  stringstream ss1;
  long *local_380;
  long local_370 [2];
  long *local_360;
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  if (expval == val) {
    testing_success = testing_success + 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::operator<<(local_1a8,expval);
    std::__cxx11::stringstream::stringstream(local_340);
    std::ostream::operator<<(local_330,val);
    std::__cxx11::stringbuf::str();
    expval_00 = local_360;
    std::__cxx11::stringbuf::str();
    TestFail((char *)expval_00,(char *)local_380,file,line,func);
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(aiStack_138);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *file, int line, const char *func = 0)
  {
  if (U(expval) != val)
    {
    std::stringstream ss1;
    ss1 << expval;
    std::stringstream ss2;
    ss2 << val;
    TestFail(ss1.str().c_str(), ss2.str().c_str(), file, line, func);
    }
  else
    ++testing_success;
  }